

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

bool __thiscall
ON_Brep::SetTrimCurve(ON_Brep *this,ON_BrepTrim *trim,int c2_index,ON_Interval *sub_domain)

{
  ON_Curve **ppOVar1;
  bool bVar2;
  ON_Interval *pOVar3;
  ON_Interval *pOVar4;
  ON_Interval real_curve_subdomain;
  ON_Interval curve_domain;
  ON_Interval local_70;
  ON_BoundingBox local_60;
  
  if (sub_domain == (ON_Interval *)0x0 && c2_index == -1) {
    trim->m_c2i = -1;
    ON_CurveProxy::SetProxyCurve(&trim->super_ON_CurveProxy,(ON_Curve *)0x0);
    ON_SimpleArray<ON_BrepTrimPoint>::SetCapacity(&trim->m_pline,0);
    ON_BoundingBox::Destroy(&trim->m_pbox);
  }
  else {
    if (c2_index < 0) {
      return false;
    }
    if ((this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count < c2_index) {
      return false;
    }
    ppOVar1 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a;
    if (ppOVar1[(uint)c2_index] == (ON_Curve *)0x0) {
      return false;
    }
    (*(ppOVar1[(uint)c2_index]->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
    pOVar3 = &local_70;
    if (sub_domain != (ON_Interval *)0x0) {
      bVar2 = ON_Interval::IsIncreasing(sub_domain);
      if (!bVar2) {
        return false;
      }
      bVar2 = ON_Interval::Includes(&local_70,sub_domain,false);
      pOVar3 = sub_domain;
      if (!bVar2) {
        return false;
      }
    }
    trim->m_c2i = c2_index;
    pOVar4 = &local_70;
    if (sub_domain != (ON_Interval *)0x0) {
      pOVar4 = sub_domain;
    }
    real_curve_subdomain.m_t[1] = pOVar4->m_t[1];
    real_curve_subdomain.m_t[0] = pOVar3->m_t[0];
    ON_CurveProxy::SetProxyCurve
              (&trim->super_ON_CurveProxy,
               (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[(uint)c2_index],
               real_curve_subdomain);
    ON_Geometry::BoundingBox
              (&local_60,
               &(this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[trim->m_c2i]->super_ON_Geometry);
    (trim->m_pbox).m_max.y = local_60.m_max.y;
    (trim->m_pbox).m_max.z = local_60.m_max.z;
    (trim->m_pbox).m_min.z = local_60.m_min.z;
    (trim->m_pbox).m_max.x = local_60.m_max.x;
    (trim->m_pbox).m_min.x = local_60.m_min.x;
    (trim->m_pbox).m_min.y = local_60.m_min.y;
    (trim->m_pbox).m_min.z = 0.0;
    (trim->m_pbox).m_max.z = 0.0;
  }
  return true;
}

Assistant:

bool ON_Brep::SetTrimCurve( 
  ON_BrepTrim& trim,
  int c2_index,
  const ON_Interval* sub_domain
  )
{
  bool rc = false;
  if ( c2_index == - 1 && !sub_domain )
  {
    trim.m_c2i = -1;
    trim.SetProxyCurve(0);
    //June 18 2013 - Chuck - nuke the bounding box and pline since it came from the old 2d curve.
    trim.DestroyPspaceInformation();
    rc = true;
  }
  else if ( c2_index >= 0 && c2_index <= m_C2.Count() && m_C2[c2_index] )
  {
    ON_Interval curve_domain = m_C2[c2_index]->Domain();
    if ( !sub_domain || (sub_domain->IsIncreasing() && curve_domain.Includes(*sub_domain)) )
    {
      trim.m_c2i = c2_index;
      trim.SetProxyCurve( m_C2[trim.m_c2i], (sub_domain) ? *sub_domain : curve_domain );
      trim.m_pbox = m_C2[trim.m_c2i]->BoundingBox();
      trim.m_pbox.m_min.z = 0.0;
      trim.m_pbox.m_max.z = 0.0;
      rc = true;
    }
  }
  return rc;
}